

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

int unqliteKvIoPageDontMakeHot(unqlite_page *pRaw)

{
  uint uVar1;
  uchar *puVar2;
  pgno pVar3;
  uchar *puVar4;
  
  if (pRaw != (unqlite_page *)0x0) {
    uVar1 = *(uint *)&pRaw[1].pUserData;
    *(uint *)&pRaw[1].pUserData = uVar1 | 0x80;
    if ((uVar1 & 0x40) != 0) {
      puVar2 = pRaw[1].zData;
      pVar3 = pRaw[3].iPage;
      puVar4 = pRaw[4].zData;
      if (pVar3 != 0) {
        *(uchar **)(pVar3 + 0x60) = puVar4;
      }
      if (puVar4 != (uchar *)0x0) {
        *(pgno *)(puVar4 + 0x58) = pVar3;
      }
      if (*(unqlite_page **)(puVar2 + 0x238) == pRaw) {
        *(uchar **)(puVar2 + 0x238) = puVar4;
      }
      if (*(unqlite_page **)(puVar2 + 0x230) == pRaw) {
        *(pgno *)(puVar2 + 0x230) = pRaw[3].iPage;
      }
      *(int *)(puVar2 + 0x240) = *(int *)(puVar2 + 0x240) + -1;
      *(uint *)&pRaw[1].pUserData = uVar1 & 0xffffffbf | 0x80;
    }
  }
  return 0;
}

Assistant:

static int unqliteKvIoPageDontMakeHot(unqlite_page *pRaw)
{
	Page *pPage = (Page *)pRaw;
	
	if( pPage == 0 ){
		/* TICKET 1433-0348 */
		return UNQLITE_OK;
	}
	pPage->flags |= PAGE_DONT_MAKE_HOT;

	/* Remove from hot dirty list if it is already there */
	if( pPage->flags & PAGE_HOT_DIRTY ){
		Pager *pPager = pPage->pPager;
		if( pPage->pNextHot ){
			pPage->pNextHot->pPrevHot = pPage->pPrevHot;
		}
		if( pPage->pPrevHot ){
			pPage->pPrevHot->pNextHot = pPage->pNextHot;
		}
		if( pPager->pFirstHot == pPage ){
			pPager->pFirstHot = pPage->pPrevHot;
		}
		if( pPager->pHotDirty == pPage ){
			pPager->pHotDirty = pPage->pNextHot;
		}
		pPager->nHot--;
		pPage->flags &= ~PAGE_HOT_DIRTY;
	}

	return UNQLITE_OK;
}